

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<long,_11>::Resize(TPZManVector<long,_11> *this,int64_t newsize,long *object)

{
  long *plVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long *plVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int64_t i;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar9 = (this->super_TPZVec<long>).fNElements;
  if (lVar9 != newsize) {
    lVar5 = (this->super_TPZVec<long>).fNAlloc;
    if (lVar5 < newsize) {
      if (newsize < 0xc) {
        if (lVar9 < 1) {
          lVar9 = 0;
        }
        else {
          plVar4 = (this->super_TPZVec<long>).fStore;
          lVar5 = 0;
          do {
            this->fExtAlloc[lVar5] = plVar4[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar9 != lVar5);
        }
        if (lVar9 < newsize) {
          do {
            this->fExtAlloc[lVar9] = *object;
            lVar9 = lVar9 + 1;
          } while (newsize != lVar9);
        }
        plVar4 = (this->super_TPZVec<long>).fStore;
        if (plVar4 != (long *)0x0 && plVar4 != this->fExtAlloc) {
          operator_delete__(plVar4);
        }
        (this->super_TPZVec<long>).fStore = this->fExtAlloc;
        (this->super_TPZVec<long>).fNElements = newsize;
        (this->super_TPZVec<long>).fNAlloc = 0xb;
      }
      else {
        dVar12 = (double)lVar5 * 1.2;
        uVar6 = (long)dVar12;
        if (dVar12 < (double)newsize) {
          uVar6 = newsize;
        }
        plVar4 = (long *)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
        lVar5 = 0;
        if (0 < lVar9) {
          plVar1 = (this->super_TPZVec<long>).fStore;
          lVar7 = 0;
          do {
            plVar4[lVar7] = plVar1[lVar7];
            lVar7 = lVar7 + 1;
            lVar5 = lVar9;
          } while (lVar9 != lVar7);
        }
        auVar3 = _DAT_014f8350;
        auVar2 = _DAT_014f8340;
        lVar9 = newsize - lVar5;
        if (lVar9 != 0 && lVar5 <= newsize) {
          lVar7 = *object;
          lVar8 = lVar9 + -1;
          auVar11._8_4_ = (int)lVar8;
          auVar11._0_8_ = lVar8;
          auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
          uVar10 = 0;
          auVar11 = auVar11 ^ _DAT_014f8350;
          do {
            auVar13._8_4_ = (int)uVar10;
            auVar13._0_8_ = uVar10;
            auVar13._12_4_ = (int)(uVar10 >> 0x20);
            auVar13 = (auVar13 | auVar2) ^ auVar3;
            if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                        auVar11._4_4_ < auVar13._4_4_) & 1)) {
              plVar4[lVar5 + uVar10] = lVar7;
            }
            if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
                auVar13._12_4_ <= auVar11._12_4_) {
              plVar4[lVar5 + uVar10 + 1] = lVar7;
            }
            uVar10 = uVar10 + 2;
          } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar10);
        }
        plVar1 = (this->super_TPZVec<long>).fStore;
        if (plVar1 != (long *)0x0 && plVar1 != this->fExtAlloc) {
          operator_delete__(plVar1);
        }
        (this->super_TPZVec<long>).fStore = plVar4;
        (this->super_TPZVec<long>).fNElements = newsize;
        (this->super_TPZVec<long>).fNAlloc = uVar6;
      }
    }
    else {
      if (lVar9 < newsize) {
        plVar4 = (this->super_TPZVec<long>).fStore;
        do {
          plVar4[lVar9] = *object;
          lVar9 = lVar9 + 1;
        } while (newsize != lVar9);
      }
      (this->super_TPZVec<long>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}